

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test2D.cpp
# Opt level: O2

bool testRandom(void)

{
  int iVar1;
  bool bVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  vector<long,_std::allocator<long>_> label;
  vector<double,_std::allocator<double>_> data;
  
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                      ,"localTestRandom",0x124,"Test Random - Start");
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  label.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  label.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  label.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1 = 0x28;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    tfs::random();
    tfs::random();
    tfs::random();
    tfs::setData(&data,&label,(DNN_NUMERIC)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),
                 (DNN_NUMERIC)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),
                 (ulong)(0.5 <= (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) &&
                        (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) != 0.5));
  }
  tfs::localTest2d(&data,&label);
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                      ,"localTestRandom",300,"Test Random - End");
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&label.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
  return true;
}

Assistant:

static bool
    localTestRandom( void ) {
        log_info( "Test Random - Start" );
        std::vector< DNN_NUMERIC > data;    // x,y pairs
        std::vector< DNN_INTEGER > label;   // binary labels.
        
        setUpDataRandom( data, label, 40 );
        
        localTest2d( data, label );
        
        log_info( "Test Random - End" );
        return true;
    }